

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::LinkFailure::Run(LinkFailure *this)

{
  CallLogWrapper *this_00;
  GLuint program;
  int iVar1;
  GLuint GVar2;
  GLuint shader;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long error;
  GLint res;
  GLuint vao;
  char *src_vsh;
  GLuint vbuf;
  char *src_fs;
  char *src_vs;
  char *varyings [2];
  long local_d8;
  uint local_d0;
  GLuint local_cc;
  long *local_c8 [2];
  long local_b8 [2];
  GLchar *local_a8;
  GLuint local_9c;
  long *local_98;
  undefined8 uStack_90;
  long local_88 [6];
  GLchar *local_58;
  GLchar *local_50;
  char *local_48;
  char *pcStack_40;
  
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  iVar1 = (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[0x18])(this);
  local_50 = (GLchar *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[0x19])(this);
  local_58 = (GLchar *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[0x1a])(this);
  local_a8 = (GLchar *)CONCAT44(extraout_var_01,iVar1);
  GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
  glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_50,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_58,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"p");
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,1,"posit");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,program,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,program);
  local_d8 = 0;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"posit","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_98,1,&local_d8);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  glu::CallLogWrapper::glUseProgram(this_00,program);
  local_98 = (long *)0x3f800000bf800000;
  uStack_90 = 0x3f80000000000000;
  local_88[0] = -0x407fffff40800000;
  local_88[1] = 0x3f80000000000000;
  local_88[2] = 0x3f8000003f800000;
  local_88[3] = 0x3f80000000000000;
  local_88[4] = 0xbf8000003f800000;
  local_88[5] = 0x3f80000000000000;
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&local_cc);
  glu::CallLogWrapper::glBindVertexArray(this_00,local_cc);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&local_9c);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,local_9c);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,&local_98,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&local_cc);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&local_9c);
  glu::CallLogWrapper::glDetachShader(this_00,program,GVar2);
  GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
  glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_a8,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  local_48 = "q";
  pcStack_40 = "z";
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,program,2,&local_48,0x8c8c);
  PIQBase::LinkProgram((PIQBase *)this,program);
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"position","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,local_c8,0xffffffff,&local_d8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_d8);
  glu::CallLogWrapper::glGetProgramInterfaceiv(this_00,program,0x92e3,0x92f5,(GLint *)&local_d0);
  if (1 < local_d0) {
    anon_unknown_0::Output("Error, expected 0 or 1 active resources, got: %d");
    local_d8 = -1;
  }
  glu::CallLogWrapper::glGetProgramInterfaceiv(this_00,program,0x92e3,0x92f6,(GLint *)&local_d0);
  if ((local_d0 != 0) && (local_d0 != 9)) {
    anon_unknown_0::Output("Error, expected 1 or 9 GL_MAX_NAME_LENGTH, got: %d");
    local_d8 = -1;
  }
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"color","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,local_c8,0xffffffff,&local_d8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_d8);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return local_d8;
}

Assistant:

virtual long Run()
	{
		const GLuint program = glCreateProgram();
		const char*  src_vs  = VertexShader_prop();
		const char*  src_fs  = FragmentShader_prop();
		const char*  src_vsh = VertexShader_fail();

		GLuint sh1 = glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(program, sh1);
		glDeleteShader(sh1);
		glShaderSource(sh1, 1, &src_vs, NULL);
		glCompileShader(sh1);

		GLuint sh2 = glCreateShader(GL_FRAGMENT_SHADER);
		glAttachShader(program, sh2);
		glDeleteShader(sh2);
		glShaderSource(sh2, 1, &src_fs, NULL);
		glCompileShader(sh2);

		glBindAttribLocation(program, 0, "p");
		glBindAttribLocation(program, 1, "posit");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "posit", 1, error);
		glUseProgram(program);

		tcu::Vec4 v[4] = { tcu::Vec4(-1, 1, 0, 1), tcu::Vec4(-1, -1, 0, 1), tcu::Vec4(1, 1, 0, 1),
						   tcu::Vec4(1, -1, 0, 1) };
		GLuint vao, vbuf;
		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbuf);
		glBindBuffer(GL_ARRAY_BUFFER, vbuf);
		glBufferData(GL_ARRAY_BUFFER, sizeof(v), v, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		glDisableVertexAttribArray(0);
		glDeleteVertexArrays(1, &vao);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glDeleteBuffers(1, &vbuf);

		glDetachShader(program, sh1);
		GLuint vsh = glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(program, vsh);
		glDeleteShader(vsh);
		glShaderSource(vsh, 1, &src_vsh, NULL);
		glCompileShader(vsh);
		const char* varyings[2] = { "q", "z" };
		glTransformFeedbackVaryings(program, 2, varyings, GL_INTERLEAVED_ATTRIBS);
		LinkProgram(program);

		GLint res;
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "position", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, &res);
		if (res != 0 && res != 1)
		{
			Output("Error, expected 0 or 1 active resources, got: %d", res);
			error = ERROR;
		}
		glGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, &res);
		if (res != 0 && res != 9)
		{
			Output("Error, expected 1 or 9 GL_MAX_NAME_LENGTH, got: %d", res);
			error = ERROR;
		}
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "color", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);

		glDeleteProgram(program);
		return error;
	}